

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

cio_error cio_socket_set_tcp_no_delay(cio_socket *socket,_Bool on)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  int tcp_no_delay;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt((socket->impl).ev.fd,6,1,local_4,4);
  cVar2 = CIO_SUCCESS;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    cVar2 = -*piVar3;
  }
  return cVar2;
}

Assistant:

enum cio_error cio_socket_set_tcp_no_delay(struct cio_socket *socket, bool on)
{
	int tcp_no_delay = (int)on;

	if (setsockopt(socket->impl.ev.fd, IPPROTO_TCP, TCP_NODELAY, &tcp_no_delay,
	               sizeof(tcp_no_delay)) < 0) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}